

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_parser.cpp
# Opt level: O1

ZCC_TreeNode * __thiscall
ZCC_AST::InitNode(ZCC_AST *this,size_t size,EZCCTreeNodeType type,ZCC_TreeNode *basis)

{
  ZCC_TreeNode *pZVar1;
  
  pZVar1 = (ZCC_TreeNode *)FMemArena::Alloc(&this->SyntaxArena,size);
  pZVar1->SiblingNext = pZVar1;
  pZVar1->SiblingPrev = pZVar1;
  pZVar1->NodeType = type;
  if (basis != (ZCC_TreeNode *)0x0) {
    pZVar1->SourceName = basis->SourceName;
    pZVar1->SourceLump = basis->SourceLump;
    pZVar1->SourceLoc = basis->SourceLoc;
  }
  return pZVar1;
}

Assistant:

ZCC_TreeNode *ZCC_AST::InitNode(size_t size, EZCCTreeNodeType type, ZCC_TreeNode *basis)
{
	ZCC_TreeNode *node = (ZCC_TreeNode *)SyntaxArena.Alloc(size);
	node->SiblingNext = node;
	node->SiblingPrev = node;
	node->NodeType = type;
	if (basis != NULL)
	{
		node->SourceName = basis->SourceName;
		node->SourceLump = basis->SourceLump;
		node->SourceLoc = basis->SourceLoc;
	}
	return node;
}